

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

bool amrex::anon_unknown_12::anon_unknown_0::squeryval<double>
               (Table *table,string *name,double *ptr,int ival,int occurrence)

{
  bool bVar1;
  PP_entry *pp;
  ostream *poVar2;
  pointer pbVar3;
  char *pcVar4;
  
  pp = ppindex(table,occurrence,name,false);
  if (pp != (PP_entry *)0x0) {
    pbVar3 = (pp->m_vals).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pp->m_vals).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) >> 5) <= ival
       ) {
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2,"ParmParse::queryval no value number");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,ival);
      std::operator<<(poVar2," for ");
      poVar2 = ErrorStream();
      if (occurrence == -1) {
        pcVar4 = "last occurrence of ";
      }
      else {
        poVar2 = std::operator<<(poVar2," occurrence ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
        pcVar4 = " of ";
      }
      std::operator<<(poVar2,pcVar4);
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2,(string *)pp);
      poVar2 = std::operator<<(poVar2,'\n');
      amrex::operator<<(poVar2,pp);
      std::operator<<(poVar2,'\n');
      Abort_host((char *)0x0);
      pbVar3 = (pp->m_vals).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    bVar1 = is<double>(pbVar3 + ival,ptr);
    if (!bVar1) {
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2,"ParmParse::queryval type mismatch on value number ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,ival);
      poVar2 = std::operator<<(poVar2," of ");
      std::operator<<(poVar2,'\n');
      poVar2 = ErrorStream();
      if (occurrence == -1) {
        pcVar4 = " last occurrence of ";
      }
      else {
        poVar2 = std::operator<<(poVar2," occurrence number ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
        pcVar4 = " of ";
      }
      std::operator<<(poVar2,pcVar4);
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2,(string *)pp);
      std::operator<<(poVar2,'\n');
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2," Expected an \"");
      poVar2 = std::operator<<(poVar2,_rfind + (*_rfind == '*'));
      poVar2 = std::operator<<(poVar2,"\" type  which can\'t be parsed from the string \"");
      poVar2 = std::operator<<(poVar2,(string *)(pbVar3 + ival));
      poVar2 = std::operator<<(poVar2,"\"\n");
      amrex::operator<<(poVar2,pp);
      std::operator<<(poVar2,'\n');
      Abort_host((char *)0x0);
    }
  }
  return pp != (PP_entry *)0x0;
}

Assistant:

bool
squeryval (const ParmParse::Table& table,
           const std::string& name,
           T&           ptr,
           int          ival,
           int          occurrence)
{
    //
    // Get last occurrence of name in table.
    //
    const ParmParse::PP_entry* def = ppindex(table, occurrence, name, false);
    if ( def == 0 )
    {
        return false;
    }
    //
    // Does it have ival values?
    //
    if ( ival >= static_cast<int>(def->m_vals.size()) )
    {
        amrex::ErrorStream() << "ParmParse::queryval no value number"
                  << ival << " for ";
        if ( occurrence ==  ParmParse::LAST )
        {
            amrex::ErrorStream() << "last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n' << *def << '\n';
        amrex::Abort();
    }

    const std::string& valname = def->m_vals[ival];

    bool ok = is(valname, ptr);
    if ( !ok )
    {
        amrex::ErrorStream() << "ParmParse::queryval type mismatch on value number "
                  << ival << " of " << '\n';
        if ( occurrence == ParmParse::LAST )
        {
            amrex::ErrorStream() << " last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence number " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n';
        amrex::ErrorStream() << " Expected an \""
                  << tok_name(ptr)
                  << "\" type  which can't be parsed from the string \""
                  << valname << "\"\n"
                  << *def << '\n';
        amrex::Abort();
    }
    return true;
}